

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O1

double kj::anon_unknown_39::parseDouble(StringPtr *s)

{
  char *in_RAX;
  int *piVar1;
  double dVar2;
  char *endPtr;
  char *local_18;
  
  if ((s->content).size_ < 2) {
    _GLOBAL__N_1::parseDouble((_GLOBAL__N_1 *)s);
  }
  else {
    local_18 = in_RAX;
    piVar1 = __errno_location();
    *piVar1 = 0;
    dVar2 = strtod((s->content).ptr,&local_18);
    if (local_18 == (s->content).ptr + ((s->content).size_ - 1)) {
      return dVar2;
    }
    _GLOBAL__N_1::parseDouble((_GLOBAL__N_1 *)s);
  }
  return 0.0;
}

Assistant:

double parseDouble(const StringPtr& s) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = strtod(s.begin(), &endPtr);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid floating number", s) { return 0; }
#if _WIN32 || __CYGWIN__ || __BIONIC__
  // When Windows' strtod() parses "nan", it returns a value with the sign bit set. But, our
  // preferred canonical value for NaN does not have the sign bit set, and all other platforms
  // return one without the sign bit set. So, on Windows, detect NaN and return our preferred
  // version.
  //
  // Cygwin seemingly does not try to emulate Linux behavior here, but rather allows Windows'
  // behavior to leak through. (Conversely, WINE actually produces the Linux behavior despite
  // trying to behave like Win32...)
  //
  // Bionic (Android) failed the unit test and so I added it to the list without investigating
  // further.
  if (isNaN(value)) {
    // NaN
    return kj::nan();
  }
#endif
  return value;
}